

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsCliqueTable.cpp
# Opt level: O3

HighsInt __thiscall HighsCliqueTable::getNumImplications(HighsCliqueTable *this,HighsInt col)

{
  pointer piVar1;
  uint uVar2;
  HighsInt numimplics;
  anon_class_16_2_ec33deae countImplics;
  HighsInt local_34;
  anon_class_16_2_ec33deae local_30;
  
  uVar2 = col << 1 | 1;
  piVar1 = (this->numcliquesvar).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_34 = piVar1[(int)uVar2] + piVar1[col * 2];
  local_30.numimplics = &local_34;
  local_30.this = this;
  HighsHashTree<int,_int>::
  for_each_recurse<void,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_coin_or[P]HiGHS_src_mip_HighsCliqueTable_cpp:1931:23)_&,_0>
            ((NodePtr)(this->invertedHashList).
                      super__Vector_base<HighsHashTree<int,_int>,_std::allocator<HighsHashTree<int,_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[col * 2].root.ptrAndType,&local_30);
  HighsHashTree<int,_int>::
  for_each_recurse<void,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_coin_or[P]HiGHS_src_mip_HighsCliqueTable_cpp:1931:23)_&,_0>
            ((NodePtr)(this->invertedHashList).
                      super__Vector_base<HighsHashTree<int,_int>,_std::allocator<HighsHashTree<int,_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[(int)uVar2].root.ptrAndType,
             &local_30);
  return local_34;
}

Assistant:

HighsInt HighsCliqueTable::getNumImplications(HighsInt col) {
  // first count all cliques as one implication, so that cliques of size two
  // are accounted for already
  HighsInt i0 = CliqueVar(col, 0).index();
  HighsInt i1 = CliqueVar(col, 1).index();
  HighsInt numimplics = numcliquesvar[i0] + numcliquesvar[i1];

  // now loop over cliques larger than size two and add the cliquelength - 1 as
  // additional implications
  auto countImplics = [&](HighsInt cliqueid) {
    HighsInt nimplics = cliques[cliqueid].end - cliques[cliqueid].start - 1;
    nimplics *= (1 + cliques[cliqueid].equality);
    numimplics += nimplics - 1;
  };
  invertedHashList[i0].for_each(countImplics);
  invertedHashList[i1].for_each(countImplics);
  return numimplics;
}